

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O0

void tsd_force_recompute(tsdn_t *tsdn)

{
  tsd_t *remote_tsd;
  tsd_t *ptStackY_98;
  malloc_mutex_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  tsdn_t *in_stack_ffffffffffffff88;
  tsd_t *ptStack_58;
  
  malloc_mutex_lock(in_stack_ffffffffffffff88,
                    (malloc_mutex_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  ptStack_58 = tsd_nominal_tsds.qlh_first;
  while (ptStack_58 != (tsd_t *)0x0) {
    in_stack_ffffffffffffff84 = 0;
    (ptStack_58->state).repr = '\x02';
    in_stack_ffffffffffffff78 = (malloc_mutex_t *)0x4;
    ptStack_58->
    cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast = 0;
    ptStack_58->
    cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast = 0;
    if ((ptStack_58->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_next ==
        tsd_nominal_tsds.qlh_first) {
      ptStackY_98 = (tsd_t *)0x0;
    }
    else {
      ptStackY_98 = (ptStack_58->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).
                    qre_next;
    }
    ptStack_58 = ptStackY_98;
  }
  malloc_mutex_unlock((tsdn_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78);
  return;
}

Assistant:

static void
tsd_force_recompute(tsdn_t *tsdn) {
	/*
	 * The stores to tsd->state here need to synchronize with the exchange
	 * in tsd_slow_update.
	 */
	atomic_fence(ATOMIC_RELEASE);
	malloc_mutex_lock(tsdn, &tsd_nominal_tsds_lock);
	tsd_t *remote_tsd;
	ql_foreach(remote_tsd, &tsd_nominal_tsds, TSD_MANGLE(tsd_link)) {
		assert(tsd_atomic_load(&remote_tsd->state, ATOMIC_RELAXED)
		    <= tsd_state_nominal_max);
		tsd_atomic_store(&remote_tsd->state,
		    tsd_state_nominal_recompute, ATOMIC_RELAXED);
		/* See comments in te_recompute_fast_threshold(). */
		atomic_fence(ATOMIC_SEQ_CST);
		te_next_event_fast_set_non_nominal(remote_tsd);
	}
	malloc_mutex_unlock(tsdn, &tsd_nominal_tsds_lock);
}